

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O0

optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t>
* __thiscall
Gudhi::ripser::
Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>
::
Simplex_coboundary_enumerator_<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Tag_dense>
::next_raw(optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t>
           *__return_storage_ptr__,
          Simplex_coboundary_enumerator_<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Tag_dense>
          *this,bool all_cofacets)

{
  uint uVar1;
  ulong uVar2;
  undefined1 index [16];
  bool bVar3;
  logic_error *this_00;
  reference piVar4;
  float *pfVar5;
  byte bVar6;
  int iVar7;
  ulong in_RCX;
  long lVar8;
  ulong extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  ulong uVar9;
  diameter_entry_t local_d8;
  coefficient_t local_ac;
  simplex_t *psStack_a8;
  coefficient_t cofacet_coefficient;
  long local_98;
  simplex_t cofacet_index;
  iterator iStack_80;
  vertex_t i;
  iterator __end0;
  iterator __begin0;
  vector<int,_std::allocator<int>_> *__range4;
  value_t cofacet_diameter;
  undefined1 local_51;
  logic_error *local_50;
  simplex_t *local_48;
  simplex_t *local_38;
  simplex_t *local_28;
  undefined1 local_11;
  Simplex_coboundary_enumerator_<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Tag_dense>
  *pSStack_10;
  bool all_cofacets_local;
  Simplex_coboundary_enumerator_<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Tag_dense>
  *this_local;
  
  local_11 = all_cofacets;
  pSStack_10 = this;
  bVar3 = has_next(this,all_cofacets);
  if (bVar3) {
    while (local_28 = Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::
                      operator()((simplex_t *)this->simplex_encoding,
                                 (Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>
                                  *)(ulong)(uint)this->j,(int)this->k,(dimension_t)in_RCX),
          uVar9 = *(ulong *)((long)&this->idx_below + 8),
          extraout_RDX <= uVar9 &&
          (ulong)(*(simplex_t **)&this->idx_below < local_28) <= uVar9 - extraout_RDX) {
      local_38 = Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::
                 operator()((simplex_t *)this->simplex_encoding,
                            (Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>
                             *)(ulong)(uint)this->j,(int)this->k,(dimension_t)extraout_RDX);
      lVar8 = (*(long *)((long)&this->idx_below + 8) - extraout_RDX_00) -
              (ulong)(*(simplex_t **)&this->idx_below < local_38);
      *(long *)&this->idx_below = (long)*(simplex_t **)&this->idx_below - (long)local_38;
      *(long *)((long)&this->idx_below + 8) = lVar8;
      local_48 = Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::
                 operator()((simplex_t *)this->simplex_encoding,
                            (Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>
                             *)(ulong)(uint)this->j,
                            (int)(char)((char)*(undefined4 *)&this->k + '\x01'),(dimension_t)lVar8);
      uVar9 = (ulong)this->idx_above;
      lVar8 = *(long *)((long)&this->idx_above + 8);
      *(ulong *)&this->idx_above = uVar9 + (long)local_48;
      *(ulong *)((long)&this->idx_above + 8) =
           lVar8 + extraout_RDX_01 + (ulong)CARRY8(uVar9,(ulong)local_48);
      this->j = this->j + -1;
      bVar6 = this->k - 1;
      in_RCX = (ulong)bVar6;
      this->k = bVar6;
      local_51 = 0;
      if (this->k == -1) {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        local_51 = 1;
        local_50 = this_00;
        std::logic_error::logic_error(this_00,"");
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
    }
    __range4._0_4_ = ripser::get_diameter(&this->simplex);
    __end0 = std::vector<int,_std::allocator<int>_>::begin(&this->vertices);
    iStack_80 = std::vector<int,_std::allocator<int>_>::end(&this->vertices);
    while (bVar3 = __gnu_cxx::operator!=(&__end0,&stack0xffffffffffffff80), bVar3) {
      piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end0);
      cofacet_index._12_4_ = *piVar4;
      cofacet_index._8_4_ =
           Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>::
           operator()(this->dist,this->j,cofacet_index._12_4_);
      pfVar5 = std::max<float>((float *)&__range4,(float *)((long)&cofacet_index + 8));
      __range4._0_4_ = *pfVar5;
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end0);
    }
    uVar9 = (ulong)this->idx_above;
    lVar8 = *(long *)((long)&this->idx_above + 8);
    uVar1 = this->j;
    iVar7 = uVar1 - 1;
    this->j = iVar7;
    psStack_a8 = Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::
                 operator()((simplex_t *)this->simplex_encoding,
                            (Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>
                             *)(ulong)uVar1,(int)(char)((char)*(undefined4 *)&this->k + '\x01'),
                            (dimension_t)iVar7);
    uVar2 = (ulong)this->idx_below;
    local_98 = uVar9 + (long)psStack_a8 + uVar2;
    cofacet_index._0_8_ =
         lVar8 + extraout_RDX_02 + (ulong)CARRY8(uVar9,(ulong)psStack_a8) +
         *(long *)((long)&this->idx_below + 8) + (ulong)CARRY8(uVar9 + (long)psStack_a8,uVar2);
    local_ac = Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>
               ::get_coefficient(this->parent,&this->simplex);
    if ((this->k & 1U) != 0) {
      local_ac = this->parent->modulus - local_ac;
    }
    index._8_8_ = lVar8;
    index._0_8_ = uVar9;
    Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>
    ::make_diameter_entry
              (&local_d8,this->parent,__range4._0_4_,(simplex_t)index,(coefficient_t)local_98);
    std::
    optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t>
    ::
    optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t,_true>
              (__return_storage_ptr__,&local_d8);
  }
  else {
    std::
    optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::diameter_entry_t>
    ::optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<diameter_entry_t> next_raw(bool all_cofacets = true) {
      if (!has_next(all_cofacets)) return std::nullopt;
      // this requires simplex_encoding(x,0)>0
      while (simplex_encoding(j, k) <= idx_below) {
        idx_below -= simplex_encoding(j, k);
        idx_above += simplex_encoding(j, k + 1);
        --j;
        --k;
        GUDHI_assert(k != -1);
      }
      value_t cofacet_diameter = get_diameter(simplex);
      // The order of j and i matters for performance
      for (vertex_t i : vertices) cofacet_diameter = std::max(cofacet_diameter, dist(j, i));
      simplex_t cofacet_index = idx_above + simplex_encoding(j--, k + 1) + idx_below;
      coefficient_t cofacet_coefficient = parent.get_coefficient(simplex);
      if (k & 1) cofacet_coefficient = parent.modulus - cofacet_coefficient;
      return parent.make_diameter_entry(cofacet_diameter, cofacet_index, cofacet_coefficient);
    }